

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effects.h
# Opt level: O0

void __thiscall
wasm::EffectAnalyzer::EffectAnalyzer(EffectAnalyzer *this,PassOptions *passOptions,Module *module)

{
  Module *module_local;
  PassOptions *passOptions_local;
  EffectAnalyzer *this_local;
  
  this->ignoreImplicitTraps = (bool)(passOptions->ignoreImplicitTraps & 1);
  this->trapsNeverHappen = (bool)(passOptions->trapsNeverHappen & 1);
  std::
  shared_ptr<std::unordered_map<wasm::Name,_wasm::EffectAnalyzer,_std::hash<wasm::Name>,_std::equal_to<wasm::Name>,_std::allocator<std::pair<const_wasm::Name,_wasm::EffectAnalyzer>_>_>_>
  ::shared_ptr(&this->funcEffectsMap,&passOptions->funcEffectsMap);
  this->module = module;
  (this->features).features = (module->features).features;
  this->branchesOut = false;
  this->calls = false;
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::set
            (&this->localsRead);
  std::set<unsigned_int,_std::less<unsigned_int>,_std::allocator<unsigned_int>_>::set
            (&this->localsWritten);
  std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::set
            (&this->mutableGlobalsRead);
  std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::set
            (&this->globalsWritten);
  this->readsMemory = false;
  this->writesMemory = false;
  this->readsTable = false;
  this->writesTable = false;
  this->readsMutableStruct = false;
  this->writesStruct = false;
  this->readsArray = false;
  this->writesArray = false;
  this->trap = false;
  this->implicitTrap = false;
  this->isAtomic = false;
  this->throws_ = false;
  this->tryDepth = 0;
  this->catchDepth = 0;
  this->danglingPop = false;
  std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::set(&this->breakTargets)
  ;
  std::set<wasm::Name,_std::less<wasm::Name>,_std::allocator<wasm::Name>_>::set
            (&this->delegateTargets);
  return;
}

Assistant:

EffectAnalyzer(const PassOptions& passOptions, Module& module)
    : ignoreImplicitTraps(passOptions.ignoreImplicitTraps),
      trapsNeverHappen(passOptions.trapsNeverHappen),
      funcEffectsMap(passOptions.funcEffectsMap), module(module),
      features(module.features) {}